

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

void dumpCKx(uint64_t cka,uint64_t value,int size)

{
  char *__format;
  
  if ((int)value == -1) {
    __format = "CK_UNAVAILABLE_INFORMATION";
  }
  else if (cka == 0x300) {
    if (value >> 0x20 == 0) {
      dumpCKH(value,size);
      return;
    }
    __format = "overflow hw feature type";
  }
  else if (cka == 0x80) {
    if (value >> 0x20 == 0) {
      dumpCKC(value,size);
      return;
    }
    __format = "overflow certificate type";
  }
  else if (cka == 0x100) {
    if (value >> 0x20 == 0) {
      dumpCKK(value,size);
      return;
    }
    __format = "overflow key type";
  }
  else if (cka == 0x166) {
    if (value >> 0x20 == 0) {
      dumpCKM(value,size);
      return;
    }
    __format = "overflow mechanism type";
  }
  else {
    if (cka != 0) {
      printf("CK_ULONG %lu(0x%lx)",value,value);
      return;
    }
    if (value >> 0x20 == 0) {
      dumpCKO(value,size);
      return;
    }
    __format = "overflow object class";
  }
  printf(__format);
  return;
}

Assistant:

void dumpCKx(uint64_t cka, uint64_t value, int size)
{
	if ((uint32_t)value == (uint32_t)~0)
	{
		printf("CK_UNAVAILABLE_INFORMATION");
		return;
	}

	switch ((unsigned long) cka)
	{
	case CKA_CLASS:
		if ((uint64_t)((uint32_t)value) != value)
		{
			printf("overflow object class");
			break;
		}
		dumpCKO((unsigned long) value, size);
		break;
	case CKA_CERTIFICATE_TYPE:
		if ((uint64_t)((uint32_t)value) != value)
		{
			printf("overflow certificate type");
			break;
		}
		dumpCKC((unsigned long) value, size);
		break;
	case CKA_KEY_TYPE:
		if ((uint64_t)((uint32_t)value) != value)
		{
			printf("overflow key type");
			break;
		}
		dumpCKK((unsigned long) value, size);
		break;
	case CKA_KEY_GEN_MECHANISM:
		if ((uint64_t)((uint32_t)value) != value)
		{
			printf("overflow mechanism type");
			break;
		}
		dumpCKM((unsigned long) value, size);
		break;
	case CKA_HW_FEATURE_TYPE:
		if ((uint64_t)((uint32_t)value) != value)
		{
			printf("overflow hw feature type");
			break;
		}
		dumpCKH((unsigned long) value, size);
		break;
	default:
		printf("CK_ULONG %lu(0x%lx)",
		       (unsigned long) value,
		       (unsigned long) value);
		break;
	}
}